

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

void __thiscall
backward::TraceResolverLinuxBase::~TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  (this->super_TraceResolverImplBase)._vptr_TraceResolverImplBase =
       (_func_int **)&PTR__TraceResolverLinuxBase_001bbbc0;
  std::__cxx11::string::~string((string *)&this->exec_path_);
  std::__cxx11::string::~string((string *)&this->argv0_);
  TraceResolverImplBase::~TraceResolverImplBase(&this->super_TraceResolverImplBase);
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}